

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O0

void __thiscall Nova::Example<float,_2>::Write_Frame_Title(Example<float,_2> *this,int frame)

{
  __cxx11 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [36];
  int local_14;
  Example<float,_2> *pEStack_10;
  int frame_local;
  Example<float,_2> *this_local;
  
  if ((this->write_frame_title & 1U) != 0) {
    local_14 = frame;
    pEStack_10 = this;
    std::operator+(local_78,(char *)&this->output_directory);
    std::__cxx11::to_string(local_98,local_14);
    std::operator+(local_58,local_78);
    std::operator+(local_38,(char *)local_58);
    File_Utilities::Write_To_Text_File<std::__cxx11::string>(local_38,&this->frame_title);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void Example<T,d>::
Write_Frame_Title(const int frame) const
{
    if(write_frame_title) File_Utilities::Write_To_Text_File(output_directory+"/"+std::to_string(frame)+"/frame_title",frame_title);
}